

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionPrimitves.cpp
# Opt level: O0

void __thiscall
Kernel::SelectedLiteral::SelectedLiteral
          (SelectedLiteral *this,Clause *clause,uint litIdx,AlascaState *shared)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Literal *in_stack_000000f0;
  InequalityNormalizer *in_stack_000000f8;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = in_EDX;
  AlascaState::norm((AlascaState *)0x840642);
  literal((SelectedLiteral *)0x840650);
  InequalityNormalizer::tryNormalizeInterpreted(in_stack_000000f8,in_stack_000000f0);
  return;
}

Assistant:

SelectedLiteral::SelectedLiteral(Clause* clause, unsigned litIdx, AlascaState& shared)
  : cl(clause)
  , litIdx(litIdx)
  , interpreted(shared.norm().tryNormalizeInterpreted(literal()))
{}